

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * cmsys::regnext(char *p)

{
  int iVar1;
  int offset;
  char *p_local;
  
  if (p == &regdummy) {
    p_local = (char *)0x0;
  }
  else {
    iVar1 = (uint)(byte)p[1] * 0x100 + (uint)(byte)p[2];
    if (iVar1 == 0) {
      p_local = (char *)0x0;
    }
    else if (*p == '\a') {
      p_local = p + -(long)iVar1;
    }
    else {
      p_local = p + iVar1;
    }
  }
  return p_local;
}

Assistant:

static char* regnext(char* p)
{
  int offset;

  if (p == regdummyptr)
    return (KWSYS_NULLPTR);

  offset = NEXT(p);
  if (offset == 0)
    return (KWSYS_NULLPTR);

  if (OP(p) == BACK)
    return (p - offset);
  else
    return (p + offset);
}